

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genRunFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,bool parallelize)

{
  pointer puVar1;
  size_type __n;
  string *psVar2;
  size_t sVar3;
  TDNode *pTVar4;
  pointer pvVar5;
  long lVar6;
  ulong uVar7;
  pointer pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t *viewID;
  pointer puVar9;
  size_t group;
  reference rVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  vector<bool,_std::allocator<bool>_> joinedGroups;
  string local_308;
  ulong local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string returnString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string *local_178;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_178 = __return_storage_ptr__;
  offset_abi_cxx11_(&local_350,this,1);
  std::operator+(&local_370,&local_350,"void run()\n");
  offset_abi_cxx11_(&local_308,this,1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,&local_308);
  std::operator+(&returnString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 "{\n");
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  offset_abi_cxx11_(&local_170,this,2);
  std::operator+(&local_150,&local_170,"int64_t startLoading = duration_cast<milliseconds>(");
  std::operator+(&local_130,&local_150,"system_clock::now().time_since_epoch()).count();\n\n");
  offset_abi_cxx11_(&local_50,this,2);
  std::operator+(&local_110,&local_130,&local_50);
  std::operator+(&local_218,&local_110,"loadRelations();\n\n");
  offset_abi_cxx11_(&local_70,this,2);
  std::operator+(&local_1f8,&local_218,&local_70);
  std::operator+(&local_1d8,&local_1f8,"int64_t loadTime = duration_cast<milliseconds>(");
  std::operator+(&local_1b8,&local_1d8,
                 "system_clock::now().time_since_epoch()).count()-startLoading;\n");
  offset_abi_cxx11_(&local_90,this,2);
  std::operator+(&local_198,&local_1b8,&local_90);
  std::operator+(&local_278,&local_198,"std::cout << \"Data loading: \"+");
  std::operator+(&local_258,&local_278,"std::to_string(loadTime)+\"ms.\\n\";\n");
  offset_abi_cxx11_(&local_b0,this,2);
  std::operator+(&local_238,&local_258,&local_b0);
  std::operator+(&local_2c0,&local_238,"std::ofstream ofs(\"times.txt\",std::ofstream::out | ");
  std::operator+(&local_2e0,&local_2c0,"std::ofstream::app);\n");
  offset_abi_cxx11_(&local_d0,this,2);
  std::operator+(&local_308,&local_2e0,&local_d0);
  std::operator+(&local_350,&local_308,"ofs << loadTime;\n");
  offset_abi_cxx11_(&local_f0,this,2);
  std::operator+(&local_370,&local_350,&local_f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"ofs.close();\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  offset_abi_cxx11_(&local_350,this,2);
  std::operator+(&local_370,&local_350,"int64_t startSorting = duration_cast<milliseconds>(");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"system_clock::now().time_since_epoch()).count();\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  if (parallelize) {
    local_2e8 = 0;
    while( true ) {
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar3 <= local_2e8) break;
      pTVar4 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_2e8);
      offset_abi_cxx11_(&local_2c0,this,2);
      std::operator+(&local_2e0,&local_2c0,"std::thread sort");
      std::operator+(&local_308,&local_2e0,&pTVar4->_name);
      std::operator+(&local_350,&local_308,"Thread(sort");
      std::operator+(&local_370,&local_350,&pTVar4->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &joinedGroups,&local_370,");\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&joinedGroups);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2c0);
      local_2e8 = local_2e8 + 1;
    }
    local_2e8 = 0;
    while( true ) {
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar3 <= local_2e8) break;
      pTVar4 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_2e8);
      offset_abi_cxx11_(&local_308,this,2);
      std::operator+(&local_350,&local_308,"sort");
      std::operator+(&local_370,&local_350,&pTVar4->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &joinedGroups,&local_370,"Thread.join();\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&joinedGroups);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_308);
      local_2e8 = local_2e8 + 1;
    }
  }
  else {
    local_2e8 = 0;
    while( true ) {
      sVar3 = TreeDecomposition::numberOfRelations
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar3 <= local_2e8) break;
      pTVar4 = TreeDecomposition::getRelation
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_2e8);
      offset_abi_cxx11_(&local_308,this,2);
      std::operator+(&local_350,&local_308,"sort");
      std::operator+(&local_370,&local_350,&pTVar4->_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &joinedGroups,&local_370,"();\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&joinedGroups);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_308);
      local_2e8 = local_2e8 + 1;
    }
  }
  offset_abi_cxx11_(&local_218,this,2);
  std::operator+(&local_1f8,"\n",&local_218);
  std::operator+(&local_1d8,&local_1f8,"int64_t sortingTime = duration_cast<milliseconds>(");
  std::operator+(&local_1b8,&local_1d8,
                 "system_clock::now().time_since_epoch()).count()-startSorting;\n");
  offset_abi_cxx11_(&local_110,this,2);
  std::operator+(&local_198,&local_1b8,&local_110);
  std::operator+(&local_278,&local_198,"std::cout << \"Data sorting: \" + ");
  std::operator+(&local_258,&local_278,"std::to_string(sortingTime)+\"ms.\\n\";\n\n");
  offset_abi_cxx11_(&local_130,this,2);
  std::operator+(&local_238,&local_258,&local_130);
  std::operator+(&local_2c0,&local_238,"ofs.open(\"times.txt\",std::ofstream::out | ");
  std::operator+(&local_2e0,&local_2c0,"std::ofstream::app);\n");
  offset_abi_cxx11_(&local_150,this,2);
  std::operator+(&local_308,&local_2e0,&local_150);
  std::operator+(&local_350,&local_308,"ofs << \"\\t\" << sortingTime;\n");
  offset_abi_cxx11_(&local_170,this,2);
  std::operator+(&local_370,&local_350,&local_170);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"ofs.close();\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  offset_abi_cxx11_(&local_350,this,2);
  std::operator+(&local_370,&local_350,"int64_t startProcess = duration_cast<milliseconds>(");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"system_clock::now().time_since_epoch()).count();\n\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  if (parallelize) {
    std::vector<bool,_std::allocator<bool>_>::vector
              (&joinedGroups,
               ((long)(this->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->viewGroups).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_370)
    ;
    uVar7 = 0;
    while( true ) {
      pvVar8 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pvVar5 - (long)pvVar8) / 0x18) <= uVar7) break;
      puVar1 = this->groupIncomingViews[uVar7].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_2e8 = uVar7;
      for (puVar9 = this->groupIncomingViews[uVar7].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
        __n = this->viewToGroupMapping[*puVar9];
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&joinedGroups,__n);
        if ((*rVar10._M_p & rVar10._M_mask) == 0) {
          offset_abi_cxx11_(&local_2e0,this,2);
          std::operator+(&local_308,&local_2e0,"group");
          std::__cxx11::to_string(&local_2c0,__n);
          std::operator+(&local_350,&local_308,&local_2c0);
          std::operator+(&local_370,&local_350,"Thread.join();\n");
          std::__cxx11::string::append((string *)&returnString);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_2e0);
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&joinedGroups,__n);
          *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
        }
      }
      offset_abi_cxx11_(&local_238,this,2);
      std::operator+(&local_2c0,&local_238,"std::thread group");
      uVar7 = local_2e8;
      std::__cxx11::to_string(&local_258,local_2e8);
      std::operator+(&local_2e0,&local_2c0,&local_258);
      std::operator+(&local_308,&local_2e0,"Thread(computeGroup");
      std::__cxx11::to_string(&local_278,uVar7);
      std::operator+(&local_350,&local_308,&local_278);
      std::operator+(&local_370,&local_350,");\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_238);
      uVar7 = uVar7 + 1;
    }
    for (uVar7 = 0; uVar7 < (ulong)(((long)pvVar5 - (long)pvVar8) / 0x18); uVar7 = uVar7 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&joinedGroups,uVar7);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) {
        offset_abi_cxx11_(&local_2e0,this,2);
        std::operator+(&local_308,&local_2e0,"group");
        std::__cxx11::to_string(&local_2c0,uVar7);
        std::operator+(&local_350,&local_308,&local_2c0);
        std::operator+(&local_370,&local_350,"Thread.join();\n");
        std::__cxx11::string::append((string *)&returnString);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
      pvVar8 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&joinedGroups.super__Bvector_base<std::allocator<bool>_>);
  }
  else {
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)(this->viewGroups).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->viewGroups).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
    {
      offset_abi_cxx11_(&local_308,this,2);
      std::operator+(&local_350,&local_308,"computeGroup");
      std::__cxx11::to_string(&local_2e0,uVar7);
      std::operator+(&local_370,&local_350,&local_2e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &joinedGroups,&local_370,"();\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&joinedGroups);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_308);
    }
  }
  offset_abi_cxx11_(&local_1b8,this,2);
  std::operator+(&local_198,"\n",&local_1b8);
  std::operator+(&local_278,&local_198,"int64_t processTime = duration_cast<milliseconds>(");
  std::operator+(&local_258,&local_278,
                 "system_clock::now().time_since_epoch()).count()-startProcess;\n");
  offset_abi_cxx11_(&local_1d8,this,2);
  std::operator+(&local_238,&local_258,&local_1d8);
  std::operator+(&local_2c0,&local_238,"std::cout << \"Data process: \"+");
  std::operator+(&local_2e0,&local_2c0,"std::to_string(processTime)+\"ms.\\n\";\n");
  offset_abi_cxx11_(&local_1f8,this,2);
  std::operator+(&local_308,&local_2e0,&local_1f8);
  std::operator+(&local_350,&local_308,
                 "ofs.open(\"times.txt\",std::ofstream::out | std::ofstream::app);\n");
  offset_abi_cxx11_(&local_218,this,2);
  std::operator+(&local_370,&local_350,&local_218);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"ofs << \"\\t\" << processTime;\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  offset_abi_cxx11_(&local_370,this,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &local_370,"std::cout << \"Size of each computed View: \" << std::endl;\n");
  std::__cxx11::string::append((string *)&returnString);
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  lVar6 = 0;
  uVar7 = 0;
  while( true ) {
    sVar3 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar3 <= uVar7) break;
    offset_abi_cxx11_(&local_2c0,this,2);
    std::operator+(&local_2e0,&local_2c0,"std::cout << \"");
    std::operator+(&local_308,&local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar6));
    std::operator+(&local_350,&local_308,": \" << ");
    std::operator+(&local_370,&local_350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar6));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &joinedGroups,&local_370,".size() << std::endl;\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&joinedGroups);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x20;
  }
  if (this->_hasApplicationHandler == false) {
    offset_abi_cxx11_(&local_308,this,2);
    std::operator+(&local_350,&local_308,"ofs << std::endl;\n");
    offset_abi_cxx11_(&local_2e0,this,2);
    std::operator+(&local_370,&local_350,&local_2e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &joinedGroups,&local_370,"ofs.close();\n\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&joinedGroups);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = &local_308;
  }
  else {
    offset_abi_cxx11_(&local_2e0,this,2);
    std::operator+(&local_308,&local_2e0,"ofs.close();\n\n");
    offset_abi_cxx11_(&local_2c0,this,2);
    std::operator+(&local_350,&local_308,&local_2c0);
    std::operator+(&local_370,&local_350,"int64_t appProcess = duration_cast<milliseconds>(");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &joinedGroups,&local_370,"system_clock::now().time_since_epoch()).count();\n\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&joinedGroups);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2e0);
    if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
      offset_abi_cxx11_(&local_370,this,2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &joinedGroups,&local_370,"std::cout << \"run Application:\\n\";\n");
      std::__cxx11::string::append((string *)&returnString);
      std::__cxx11::string::~string((string *)&joinedGroups);
      std::__cxx11::string::~string((string *)&local_370);
    }
    offset_abi_cxx11_(&local_370,this,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &joinedGroups,&local_370,"runApplication();\n");
    std::__cxx11::string::append((string *)&returnString);
    std::__cxx11::string::~string((string *)&joinedGroups);
    this_00 = &local_370;
  }
  std::__cxx11::string::~string((string *)this_00);
  offset_abi_cxx11_(&local_370,this,1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 &returnString,&local_370);
  psVar2 = local_178;
  std::operator+(local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&joinedGroups,
                 "}\n");
  std::__cxx11::string::~string((string *)&joinedGroups);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&returnString);
  return psVar2;
}

Assistant:

std::string CppGenerator::genRunFunction(bool parallelize)
{
    std::string returnString = offset(1)+"void run()\n"+
        offset(1)+"{\n";
    
    returnString += offset(2)+"int64_t startLoading = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"loadRelations();\n\n"+
        offset(2)+"int64_t loadTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startLoading;\n"+
        offset(2)+"std::cout << \"Data loading: \"+"+
        "std::to_string(loadTime)+\"ms.\\n\";\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << loadTime;\n"+
        offset(2)+"ofs.close();\n\n";
    
    returnString += offset(2)+"int64_t startSorting = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"();\n";
        }
    }
    else
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"std::thread sort"+node->_name+
                "Thread(sort"+node->_name+");\n";
        }

        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t sortingTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startSorting;\n"+
        offset(2)+"std::cout << \"Data sorting: \" + "+
        "std::to_string(sortingTime)+\"ms.\\n\";\n\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << sortingTime;\n"+
        offset(2)+"ofs.close();\n\n";

    returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t group = 0; group < viewGroups.size(); ++group)
            returnString += offset(2)+"computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        std::vector<bool> joinedGroups(viewGroups.size());
    
        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            for (const size_t& viewID : groupIncomingViews[group])
            {
                // find group that contains this view!
                size_t otherGroup = viewToGroupMapping[viewID];
                if (!joinedGroups[otherGroup])
                {
                    returnString += offset(2)+"group"+std::to_string(otherGroup)+
                        "Thread.join();\n";
                    joinedGroups[otherGroup] = 1;
                }
            }

            returnString += offset(2)+"std::thread group"+std::to_string(group)+
                    "Thread(computeGroup"+std::to_string(group)+");\n";            
        }

        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            if (!joinedGroups[group])
                returnString += offset(2)+"group"+std::to_string(group)+
                    "Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t processTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Data process: \"+"+
        "std::to_string(processTime)+\"ms.\\n\";\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << processTime;\n";
    
    // if (BENCH_INDIVIDUAL)    
    returnString += offset(2)+"std::cout << \"Size of each computed View: \" << std::endl;\n";
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {
        returnString += offset(2)+"std::cout << \""+viewName[view]+": \" << "+
            viewName[view]+".size() << std::endl;\n";
    }
    
    if (_hasApplicationHandler)
    {
        returnString += offset(2)+"ofs.close();\n\n"+
            offset(2)+"int64_t appProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

        if (BENCH_INDIVIDUAL)
            returnString += offset(2)+"std::cout << \"run Application:\\n\";\n";

        returnString += offset(2)+"runApplication();\n"; 
    }
    else {        
        returnString += offset(2)+"ofs << std::endl;\n"+
            offset(2)+"ofs.close();\n\n";
    }
    
    return returnString+offset(1)+"}\n";
}